

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte local_242;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  string cdup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_parse;
  string local_40 [8];
  string git;
  cmCTestGIT *this_local;
  string *top_dir;
  
  git.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  std::__cxx11::string::string
            (local_40,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  cdup.field_2._M_local_buf[0xd] = '\x01';
  std::__cxx11::string::string((string *)&local_d8,local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"rev-parse",(allocator<char> *)(cdup.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"--show-cdup",(allocator<char> *)(cdup.field_2._M_local_buf + 0xe));
  cdup.field_2._M_local_buf[0xd] = '\0';
  local_78 = &local_d8;
  local_70 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(cdup.field_2._M_local_buf + 0xc));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(cdup.field_2._M_local_buf + 0xc));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(cdup.field_2._M_local_buf + 0xc));
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
  do {
    local_220 = local_220 + -1;
    std::__cxx11::string::~string((string *)local_220);
  } while (local_220 != &local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(cdup.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(cdup.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&rev_parse_out.Line1);
  OneLineParser::OneLineParser
            ((OneLineParser *)&rev_parse_err.super_LineParser.Separator,this,"rev-parse-out> ",
             (string *)&rev_parse_out.Line1);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_190,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-parse-err> ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,(OutputParser *)&rev_parse_err.super_LineParser.Separator,
                              (OutputParser *)local_190,&local_1b0,UTF8);
  local_242 = 0;
  if (bVar1) {
    local_242 = std::__cxx11::string::empty();
    local_242 = local_242 ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  if ((local_242 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&rev_parse_out.Line1);
    cmsys::SystemTools::CollapseFullPath(&local_1d8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  git.field_2._M_local_buf[0xf] = '\x01';
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_190);
  OneLineParser::~OneLineParser((OneLineParser *)&rev_parse_err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)&rev_parse_out.Line1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string(local_40);
  if ((git.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_parse = { git, "rev-parse", "--show-cdup" };
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err, "",
                     cmProcessOutput::UTF8) &&
      !cdup.empty()) {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
  }
  return top_dir;
}